

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
pg::ZLKPPSolver::get_nodes_of_max_priority
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ZLKPPSolver *this,
          int max_priority)

{
  iterator __position;
  Game *pGVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  uint *puVar5;
  int v;
  int local_24;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->cur_num_nodes != 0) {
    local_24 = this->cur_nodes_prev[this->cur_first_node];
    lVar3 = (long)local_24;
    if (((this->super_Solver).game)->_priority[lVar3] == max_priority) {
      do {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_24)
          ;
        }
        else {
          *__position._M_current = (int)lVar3;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pGVar1 = (this->super_Solver).game;
        piVar2 = pGVar1->_outedges;
        lVar3 = (long)pGVar1->_firstouts[local_24];
        uVar4 = piVar2[lVar3];
        if ((int)uVar4 < 0) {
LAB_00178d48:
          __assert_fail("*ptr2 >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/zlkpp.cpp"
                        ,0x80,"std::vector<int> pg::ZLKPPSolver::get_nodes_of_max_priority(int)");
        }
        puVar5 = (uint *)(piVar2 + lVar3 + 1);
        while (this->cur_nodes_bm[uVar4] != true) {
          uVar4 = *puVar5;
          puVar5 = puVar5 + 1;
          if ((int)uVar4 < 0) goto LAB_00178d48;
        }
        this->strategy[local_24] = uVar4;
        if (local_24 == this->cur_first_node) {
          return __return_storage_ptr__;
        }
        local_24 = this->cur_nodes_prev[local_24];
        lVar3 = (long)local_24;
      } while (((this->super_Solver).game)->_priority[lVar3] == max_priority);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ZLKPPSolver::get_nodes_of_max_priority(int max_priority) {
    std::vector<int> top;
    if (!cur_num_nodes)
        return top;
    int v = cur_nodes_prev[cur_first_node];
    while (priority(v) == max_priority) {
        top.push_back(v);
        const int *ptr2 = outs(v);
        for (;; ++ptr2) {
            assert(*ptr2 >= 0);
            if (cur_nodes_bm[*ptr2])
                break;
        }
        strategy[v] = *ptr2; // we can go to an arbitrary node that is currently in the game
        if (v == cur_first_node)
            break;
        v = cur_nodes_prev[v];
    }
    return top; // the returned vector is sorted
}